

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_undo.cpp
# Opt level: O3

void single_perform_undo_proc(Am_Object *undo_handler)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Object last_command;
  Am_Object local_38;
  Am_Value local_30;
  Am_Value local_20;
  Am_Object local_10;
  
  local_38.data = (Am_Object_Data *)0x0;
  in_value = Am_Object::Get(undo_handler,0xc5,0);
  Am_Object::operator=(&local_38,in_value);
  bVar1 = Am_Object::Valid(&local_38);
  if (bVar1) {
    Am_Value::Am_Value(&local_20,&Am_No_Value);
    Am_Value::Am_Value(&local_30,&Am_No_Value);
    am_perform_on_cmd_and_impls
              (&local_10,(Am_Slot_Key)&local_38,true,(Am_Value *)0x0,&local_20,SUB81(&local_30,0));
    Am_Object::~Am_Object(&local_10);
    Am_Value::~Am_Value(&local_30);
    Am_Value::~Am_Value(&local_20);
    Am_Object::~Am_Object(&local_38);
    return;
  }
  Am_Error("No last command to undo for Single Undo Handler");
}

Assistant:

Am_Define_Object_Formula(single_undo_allowed_form)
{
  Am_Object last_command;
  last_command = self.Get(Am_COMMAND);
  return last_command;
}